

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *this_00;
  int iVar3;
  int local_1f0;
  allocator local_1e9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  string destination;
  string arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if (argc < 3) {
    std::__cxx11::string::string((string *)&local_b0,*argv,(allocator *)&destination);
    show_usage(&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    local_1f0 = 1;
  }
  else {
    sources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    destination._M_dataplus._M_p = (pointer)&destination.field_2;
    destination._M_string_length = 0;
    sources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    destination.field_2._M_local_buf[0] = '\0';
    local_1f0 = 0;
    iVar3 = 1;
    do {
      if (argc <= iVar3) {
        bVar1 = std::operator==(&destination,"");
        if (((bVar1) ||
            ((long)sources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)sources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != 0x20)) ||
           ((bVar1 = std::operator!=(&destination,"0"), bVar1 &&
            (((bVar1 = std::operator!=(&destination,"1"), bVar1 &&
              (bVar1 = std::operator!=(&destination,"2"), bVar1)) &&
             (bVar1 = std::operator!=(&destination,"3"), bVar1)))))) {
          std::__cxx11::string::string((string *)&local_d0,*argv,(allocator *)&arg);
          show_usage(&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          local_1f0 = 1;
        }
        else {
          bVar1 = std::operator==(&destination,"0");
          if (bVar1) {
            std::__cxx11::string::string
                      ((string *)&local_f0,
                       (string *)
                       sources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            encode(&local_f0);
            this_00 = &local_f0;
          }
          else {
            bVar1 = std::operator==(&destination,"1");
            if (bVar1) {
              std::__cxx11::string::string
                        ((string *)&local_110,
                         (string *)
                         sources.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
              decode(&local_110);
              this_00 = &local_110;
            }
            else {
              bVar1 = std::operator==(&destination,"2");
              if (bVar1) {
                std::__cxx11::string::string
                          ((string *)&local_130,
                           (string *)
                           sources.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                encode(&local_130);
                std::__cxx11::string::~string((string *)&local_130);
                std::__cxx11::string::substr
                          ((ulong)&arg,
                           (ulong)sources.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                std::operator+(&local_150,&arg,".rle");
                decode(&local_150);
                this = &local_150;
              }
              else {
                std::__cxx11::string::string
                          ((string *)&local_170,
                           (string *)
                           sources.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                encodeImagePackBits(&local_170);
                std::__cxx11::string::~string((string *)&local_170);
                std::__cxx11::string::substr
                          ((ulong)&arg,
                           (ulong)sources.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                std::operator+(&local_190,&arg,"_packbits.rle");
                decodeImagePackBits(&local_190);
                this = &local_190;
              }
              std::__cxx11::string::~string((string *)this);
              this_00 = &arg;
            }
          }
          std::__cxx11::string::~string((string *)this_00);
          local_1f0 = 0;
        }
        break;
      }
      std::__cxx11::string::string((string *)&arg,argv[iVar3],(allocator *)&local_90);
      bVar1 = std::operator==(&arg,"-h");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--help"), bVar1)) {
        std::__cxx11::string::string((string *)&local_50,*argv,(allocator *)&local_90);
        show_usage(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        local_1f0 = 0;
        bVar1 = false;
      }
      else {
        bVar1 = std::operator==(&arg,"-t");
        if ((bVar1) || (bVar1 = std::operator==(&arg,"--type"), bVar1)) {
          if (argc == 3) {
            std::__cxx11::string::string((string *)&local_70,*argv,(allocator *)&local_90);
            show_usage(&local_70);
            std::__cxx11::string::~string((string *)&local_70);
          }
          else {
            if (iVar3 + 1 < argc) {
              bVar1 = true;
              std::__cxx11::string::assign((char *)&destination);
              iVar3 = iVar3 + 1;
              goto LAB_0010421a;
            }
            poVar2 = std::operator<<((ostream *)&std::cerr,"--type option needs one argument.");
            std::endl<char,std::char_traits<char>>(poVar2);
          }
          bVar1 = false;
          local_1f0 = 1;
        }
        else {
          std::__cxx11::string::string((string *)&local_90,argv[iVar3],&local_1e9);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sources,
                     &local_90);
          std::__cxx11::string::~string((string *)&local_90);
          bVar1 = true;
        }
      }
LAB_0010421a:
      std::__cxx11::string::~string((string *)&arg);
      iVar3 = iVar3 + 1;
    } while (bVar1);
    std::__cxx11::string::~string((string *)&destination);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sources);
  }
  return local_1f0;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc < 3)
    {
        show_usage(argv[0]);
        return 1;
    }
    std::vector <std::string> sources;
    std::string destination;

    for (int i = 1; i < argc; ++i) {
        std::string arg = argv[i];
        if ((arg == "-h") || (arg == "--help")) {
            show_usage(argv[0]);
            return 0;
        } else if ((arg == "-t") || (arg == "--type")) {
            if (argc < 4)
            {
                show_usage(argv[0]);
                return 1;
            }
            if (i + 1 < argc) {                                     // Make sure we aren't at the end of argv!
                destination = argv[++i];
            } else {
                  std::cerr << "--type option needs one argument." << std::endl;
                return 1;
            }
        } else {
            sources.push_back(argv[i]);
        }
    }
    if (destination == "" || sources.size() != 1 || (destination != "0" && destination != "1" && destination != "2" && destination != "3"))
    {
        show_usage(argv[0]);
        return 1;
    }
    /*
    0 - encode image
    1 - decode image
    2 - encode and decode image
    3 - encode and decode image with the PackBits algorithm
    */
    if (destination == "0")
            encode(sources[0]);
    else if (destination == "1")
            decode(sources[0]);
    else if (destination == "2")
    {
        encode(sources[0]);
        decode(sources[0].substr(0, sources[0].size()-4) + ".rle");
    }
    else
    {
        encodeImagePackBits(sources[0]);
        decodeImagePackBits(sources[0].substr(0, sources[0].size()-4) + "_packbits.rle");
    }

    return 0;
}